

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup *
vkt::SpirVAssembly::anon_unknown_5::createOpSModComputeGroup
          (TestContext *testCtx,qpTestResult negFailResult)

{
  long *plVar1;
  int *piVar2;
  uint uVar3;
  char *pcVar4;
  deUint32 seed;
  TestNode *pTVar5;
  char *pcVar6;
  long *plVar7;
  undefined8 *puVar8;
  BufferInterface *pBVar9;
  SpvAsmComputeShaderCase *this;
  int iVar10;
  ulong *puVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int ndx;
  _func_bool_long *in_R9;
  long lVar15;
  pointer piVar16;
  bool bVar17;
  vector<int,_std::allocator<int>_> inputInts2;
  vector<int,_std::allocator<int>_> inputInts1;
  vector<int,_std::allocator<int>_> outputInts;
  Random rnd;
  CaseParams cases [2];
  BufferInterface *in_stack_fffffffffffffd88;
  BufferInterface *pBVar18;
  BufferInterface local_268;
  long lStack_260;
  allocator<char> local_252;
  allocator<char> local_251;
  TestNode *local_250;
  vector<int,_std::allocator<int>_> local_248;
  vector<int,_std::allocator<int>_> local_228;
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198 [2];
  TestContext *local_188;
  long *local_180 [2];
  long local_170 [2];
  deRandom local_160;
  undefined1 local_150 [64];
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  local_110;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  local_f8;
  int local_e0 [4];
  pointer local_d0;
  pointer local_c0;
  qpTestResult local_b8;
  _Alloc_hider local_b0;
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_88 [2];
  qpTestResult local_78 [6];
  char *local_60;
  char *local_58;
  qpTestResult local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  local_188 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,testCtx,"opsmod","Test the OpSMod instruction");
  seed = deStringHash((pTVar5->m_name)._M_dataplus._M_p);
  deRandom_init(&local_160,seed);
  local_88[0] = "positive";
  local_88[1] = "Output doesn\'t match with expected";
  local_78[0] = QP_TEST_RESULT_FAIL;
  local_78[1] = QP_TEST_RESULT_PASS;
  local_78[2] = 0x10000;
  local_78[3] = QP_TEST_RESULT_PASS;
  local_78[4] = 100;
  local_60 = "all";
  local_58 = "Inconsistent results, but within specification";
  local_4c = 0x10000ffff0000;
  uStack_44 = 0x64ffffff9c;
  lVar13 = 0;
  local_250 = pTVar5;
  local_50 = negFailResult;
  do {
    iVar12 = (int)in_stack_fffffffffffffd88;
    ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_150);
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    piVar16 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar16;
    memset(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar16;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    piVar16 = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar16;
    memset(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar16;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    piVar16 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar16;
    memset(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    iVar10 = 200;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar16;
    fillRandomScalars<int>
              ((Random *)&local_160,local_78[lVar13 * 10 + 1],local_78[lVar13 * 10 + 2],
               local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,200,(int)in_R9);
    SpirVAssembly::(anonymous_namespace)::fillRandomScalars<int,bool(*)(long)>
              ((Random *)&local_160,local_78[lVar13 * 10 + 3],local_78[lVar13 * 10 + 4],
               local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,iVar10,in_R9,iVar12);
    lVar15 = 0;
    do {
      uVar3 = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15];
      iVar12 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15] % (int)uVar3;
      iVar10 = ((int)(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15] ^ uVar3) >> 0x1f & uVar3) + iVar12;
      if (iVar12 == 0) {
        iVar10 = 0;
      }
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar15] = iVar10;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 200);
    pcVar6 = getComputeAsmShaderPreamble();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_180,pcVar6,&local_251);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_180);
    local_1c8 = &local_1b8;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_1b8 = *puVar11;
      lStack_1b0 = plVar7[3];
    }
    else {
      local_1b8 = *puVar11;
      local_1c8 = (ulong *)*plVar7;
    }
    local_1c0 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pcVar6 = getComputeAsmCommonTypes();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar6,&local_252);
    uVar14 = 0xf;
    if (local_1c8 != &local_1b8) {
      uVar14 = local_1b8;
    }
    if (uVar14 < (ulong)(local_1a0 + local_1c0)) {
      uVar14 = 0xf;
      if (local_1a8 != local_198) {
        uVar14 = local_198[0];
      }
      if (uVar14 < (ulong)(local_1a0 + local_1c0)) goto LAB_005905d0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1c8);
    }
    else {
LAB_005905d0:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a8);
    }
    local_208 = &local_1f8;
    plVar7 = puVar8 + 2;
    if ((long *)*puVar8 == plVar7) {
      local_1f8 = *plVar7;
      uStack_1f0 = puVar8[3];
    }
    else {
      local_1f8 = *plVar7;
      local_208 = (long *)*puVar8;
    }
    local_200 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_208);
    pBVar9 = (BufferInterface *)(plVar7 + 2);
    if ((BufferInterface *)*plVar7 == pBVar9) {
      local_268._vptr_BufferInterface = pBVar9->_vptr_BufferInterface;
      lStack_260 = plVar7[3];
      pBVar18 = &local_268;
    }
    else {
      local_268._vptr_BufferInterface = pBVar9->_vptr_BufferInterface;
      pBVar18 = (BufferInterface *)*plVar7;
    }
    *plVar7 = (long)pBVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_150,(string *)&stack0xfffffffffffffd88);
    if (pBVar18 != &local_268) {
      operator_delete(pBVar18,(long)local_268._vptr_BufferInterface + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_180[0] != local_170) {
      operator_delete(local_180[0],local_170[0] + 1);
    }
    puVar8 = (undefined8 *)operator_new(0x20);
    *puVar8 = &PTR__Buffer_00d5a018;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(puVar8 + 1),&local_228);
    plVar7 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar7 + 1) = 0;
    *(undefined4 *)((long)plVar7 + 0xc) = 0;
    *plVar7 = (long)&PTR__SharedPtrState_00d59fd8;
    plVar7[2] = (long)puVar8;
    *(undefined4 *)(plVar7 + 1) = 1;
    *(undefined4 *)((long)plVar7 + 0xc) = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                *)&local_110,
               (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&stack0xfffffffffffffd88);
    if (plVar7 != (long *)0x0) {
      LOCK();
      plVar1 = plVar7 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar7 + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)plVar7 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 8))();
      }
    }
    puVar8 = (undefined8 *)operator_new(0x20);
    *puVar8 = &PTR__Buffer_00d5a018;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(puVar8 + 1),&local_248);
    plVar7 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar7 + 1) = 0;
    *(undefined4 *)((long)plVar7 + 0xc) = 0;
    *plVar7 = (long)&PTR__SharedPtrState_00d59fd8;
    plVar7[2] = (long)puVar8;
    *(undefined4 *)(plVar7 + 1) = 1;
    *(undefined4 *)((long)plVar7 + 0xc) = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                *)&local_110,
               (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&stack0xfffffffffffffd88);
    if (plVar7 != (long *)0x0) {
      LOCK();
      plVar1 = plVar7 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar7 + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)plVar7 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 8))();
      }
    }
    pBVar9 = (BufferInterface *)operator_new(0x20);
    pBVar9->_vptr_BufferInterface = (_func_int **)&PTR__Buffer_00d5a018;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(pBVar9 + 1),&local_1e8);
    in_stack_fffffffffffffd88 = pBVar9;
    plVar7 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar7 + 1) = 0;
    *(undefined4 *)((long)plVar7 + 0xc) = 0;
    *plVar7 = (long)&PTR__SharedPtrState_00d59fd8;
    plVar7[2] = (long)pBVar9;
    *(undefined4 *)(plVar7 + 1) = 1;
    *(undefined4 *)((long)plVar7 + 0xc) = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                *)&local_f8,
               (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&stack0xfffffffffffffd88);
    if (plVar7 != (long *)0x0) {
      LOCK();
      plVar1 = plVar7 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        in_stack_fffffffffffffd88 = (BufferInterface *)0x0;
        (**(code **)(*plVar7 + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)plVar7 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 8))();
      }
    }
    pcVar4 = local_a8;
    local_e0[0] = 200;
    local_e0[1] = 1;
    local_e0[2] = 1;
    local_b8 = local_78[lVar13 * 10];
    pcVar6 = local_88[lVar13 * 5 + 1];
    strlen(pcVar6);
    pTVar5 = local_250;
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,pcVar4,(ulong)pcVar6);
    this = (SpvAsmComputeShaderCase *)operator_new(0x140);
    in_R9 = (_func_bool_long *)0x0;
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this,local_188,local_88[lVar13 * 5],"",(ComputeShaderSpec *)local_150,
               COMPUTE_TEST_USES_NONE);
    tcu::TestNode::addChild(pTVar5,(TestNode *)this);
    if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if (local_d0 != (pointer)0x0) {
      operator_delete(local_d0,(long)local_c0 - (long)local_d0);
    }
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::~vector(&local_f8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::~vector(&local_110);
    if ((undefined1 *)local_150._32_8_ != local_150 + 0x30) {
      operator_delete((void *)local_150._32_8_,local_150._48_8_ + 1);
    }
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    bVar17 = lVar13 != 0;
    lVar13 = lVar13 + 1;
    if (bVar17) {
      return (TestCaseGroup *)pTVar5;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createOpSModComputeGroup (tcu::TestContext& testCtx, qpTestResult negFailResult)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opsmod", "Test the OpSMod instruction"));
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 200;

	const struct CaseParams
	{
		const char*		name;
		const char*		failMessage;		// customized status message
		qpTestResult	failResult;			// override status on failure
		int				op1Min, op1Max;		// operand ranges
		int				op2Min, op2Max;
	} cases[] =
	{
		{ "positive",	"Output doesn't match with expected",				QP_TEST_RESULT_FAIL,	0,		65536,	0,		100 },
		{ "all",		"Inconsistent results, but within specification",	negFailResult,			-65536,	65536,	-100,	100 },	// see below
	};
	// If either operand is negative the result is undefined. Some implementations may still return correct values.

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		const CaseParams&	params		= cases[caseNdx];

		ComputeShaderSpec	spec;
		vector<deInt32>		inputInts1	(numElements, 0);
		vector<deInt32>		inputInts2	(numElements, 0);
		vector<deInt32>		outputInts	(numElements, 0);

		fillRandomScalars(rnd, params.op1Min, params.op1Max, &inputInts1[0], numElements);
		fillRandomScalars(rnd, params.op2Min, params.op2Max, &inputInts2[0], numElements, filterNotZero);

		for (int ndx = 0; ndx < numElements; ++ndx)
		{
			deInt32 rem = inputInts1[ndx] % inputInts2[ndx];
			if (rem == 0)
			{
				outputInts[ndx] = 0;
			}
			else if ((inputInts1[ndx] >= 0) == (inputInts2[ndx] >= 0))
			{
				// They have the same sign
				outputInts[ndx] = rem;
			}
			else
			{
				// They have opposite sign.  The remainder operation takes the
				// sign inputInts1[ndx] but OpSMod is supposed to take ths sign
				// of inputInts2[ndx].  Adding inputInts2[ndx] will ensure that
				// the result has the correct sign and that it is still
				// congruent to inputInts1[ndx] modulo inputInts2[ndx]
				//
				// See also http://mathforum.org/library/drmath/view/52343.html
				outputInts[ndx] = rem + inputInts2[ndx];
			}
		}

		spec.assembly =
			string(getComputeAsmShaderPreamble()) +

			"OpName %main           \"main\"\n"
			"OpName %id             \"gl_GlobalInvocationID\"\n"

			"OpDecorate %id BuiltIn GlobalInvocationId\n"

			"OpDecorate %buf BufferBlock\n"
			"OpDecorate %indata1 DescriptorSet 0\n"
			"OpDecorate %indata1 Binding 0\n"
			"OpDecorate %indata2 DescriptorSet 0\n"
			"OpDecorate %indata2 Binding 1\n"
			"OpDecorate %outdata DescriptorSet 0\n"
			"OpDecorate %outdata Binding 2\n"
			"OpDecorate %i32arr ArrayStride 4\n"
			"OpMemberDecorate %buf 0 Offset 0\n"

			+ string(getComputeAsmCommonTypes()) +

			"%buf        = OpTypeStruct %i32arr\n"
			"%bufptr     = OpTypePointer Uniform %buf\n"
			"%indata1    = OpVariable %bufptr Uniform\n"
			"%indata2    = OpVariable %bufptr Uniform\n"
			"%outdata    = OpVariable %bufptr Uniform\n"

			"%id        = OpVariable %uvec3ptr Input\n"
			"%zero      = OpConstant %i32 0\n"

			"%main      = OpFunction %void None %voidf\n"
			"%label     = OpLabel\n"
			"%idval     = OpLoad %uvec3 %id\n"
			"%x         = OpCompositeExtract %u32 %idval 0\n"
			"%inloc1    = OpAccessChain %i32ptr %indata1 %zero %x\n"
			"%inval1    = OpLoad %i32 %inloc1\n"
			"%inloc2    = OpAccessChain %i32ptr %indata2 %zero %x\n"
			"%inval2    = OpLoad %i32 %inloc2\n"
			"%rem       = OpSMod %i32 %inval1 %inval2\n"
			"%outloc    = OpAccessChain %i32ptr %outdata %zero %x\n"
			"             OpStore %outloc %rem\n"
			"             OpReturn\n"
			"             OpFunctionEnd\n";

		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts1)));
		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts2)));
		spec.outputs.push_back	(BufferSp(new Int32Buffer(outputInts)));
		spec.numWorkGroups		= IVec3(numElements, 1, 1);
		spec.failResult			= params.failResult;
		spec.failMessage		= params.failMessage;

		group->addChild(new SpvAsmComputeShaderCase(testCtx, params.name, "", spec));
	}

	return group.release();
}